

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
WriteFor(BitpackingWriter *this,hugeint_t *values,bool *validity,bitpacking_width_t width,
        hugeint_t frame_of_reference,idx_t count,void *data_ptr)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  idx_t iVar3;
  undefined7 in_register_00000009;
  idx_t count_00;
  hugeint_t local_48;
  
  count_00 = frame_of_reference.upper;
  iVar3 = BitpackingPrimitives::GetRequiredSize(count_00,(bitpacking_width_t)validity);
  ReserveSpace((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)count,
               iVar3 + 0x20);
  WriteMetaData((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)count,FOR)
  ;
  puVar1 = *(undefined8 **)(count + 0x40);
  *puVar1 = CONCAT71(in_register_00000009,width);
  puVar1[1] = frame_of_reference.lower;
  *(undefined8 **)(count + 0x40) = puVar1 + 2;
  hugeint_t::hugeint_t(&local_48,(ulong)validity & 0xffffffff);
  puVar2 = *(uint64_t **)(count + 0x40);
  *puVar2 = local_48.lower;
  puVar2[1] = local_48.upper;
  *(uint64_t **)(count + 0x40) = puVar2 + 2;
  BitpackingPrimitives::PackBuffer<duckdb::hugeint_t,false>
            ((data_ptr_t)(puVar2 + 2),(hugeint_t *)this,count_00,(bitpacking_width_t)validity);
  *(long *)(count + 0x40) = *(long *)(count + 0x40) + iVar3;
  UpdateStats((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)count,
              count_00);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}